

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O3

FMFieldPtr get_FMfieldPtrFromList(FMFieldList field_list,char *fieldname)

{
  char *__s1;
  int iVar1;
  FMdata_type FVar2;
  FMFieldPtr p_Var3;
  
  __s1 = field_list->field_name;
  while( true ) {
    if (__s1 == (char *)0x0) {
      return (FMFieldPtr)0x0;
    }
    iVar1 = strcmp(__s1,fieldname);
    if (iVar1 == 0) break;
    __s1 = field_list[1].field_name;
    field_list = field_list + 1;
  }
  FVar2 = FMstr_to_data_type(field_list->field_type);
  if (FVar2 == unknown_type) {
    get_FMfieldPtrFromList_cold_1();
    return (FMFieldPtr)0x0;
  }
  p_Var3 = (FMFieldPtr)ffs_malloc(0x18);
  p_Var3->src_float_format = '\0';
  p_Var3->target_float_format = (undefined1)fm_my_float_format;
  p_Var3->offset = (long)field_list->field_offset;
  p_Var3->size = field_list->field_size;
  p_Var3->data_type = FVar2;
  p_Var3->byte_swap = '\0';
  return p_Var3;
}

Assistant:

extern FMFieldPtr
get_FMfieldPtrFromList(FMFieldList field_list, const char *fieldname)
{
    int index;
    FMFieldPtr ret_val;
    FMdata_type data_type;

    for (index = 0; field_list[index].field_name != NULL; index++) {
	if (strcmp(field_list[index].field_name, fieldname) == 0) {
	    break;
	}
    }
    if (field_list[index].field_name == NULL)
	return NULL;

    data_type = FMstr_to_data_type(field_list[index].field_type);
    if (data_type == unknown_type) {
	fprintf(stderr, "Unknown field type for field %s\n",
		field_list[index].field_name);
	return NULL;
    }
    ret_val = (FMFieldPtr) malloc(sizeof(*ret_val));
    ret_val->src_float_format = Format_Unknown;
    ret_val->target_float_format = fm_my_float_format;
    ret_val->offset = field_list[index].field_offset;
    ret_val->size = field_list[index].field_size;
    ret_val->data_type = data_type;
    ret_val->byte_swap = 0;
    return ret_val;
}